

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImFont::AddGlyph(ImFont *this,ImWchar codepoint,float x0,float y0,float x1,float y1,float u0,
                float v0,float u1,float v1,float advance_x)

{
  ImFontGlyph *pIVar1;
  ushort in_SI;
  long in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float in_XMM5_Da;
  float in_XMM6_Da;
  float in_XMM7_Da;
  float in_stack_00000008;
  ImFontGlyph *glyph;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  bool bVar2;
  
  ImVector<ImFontGlyph>::resize
            ((ImVector<ImFontGlyph> *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
             (int)((ulong)in_RDI >> 0x20));
  pIVar1 = ImVector<ImFontGlyph>::back
                     ((ImVector<ImFontGlyph> *)
                      CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  *(uint *)pIVar1 = *(uint *)pIVar1 & 0x80000000 | (uint)in_SI;
  bVar2 = false;
  if ((in_XMM0_Da != in_XMM2_Da) || (NAN(in_XMM0_Da) || NAN(in_XMM2_Da))) {
    bVar2 = in_XMM1_Da != in_XMM3_Da;
  }
  *(uint *)pIVar1 = *(uint *)pIVar1 & 0x7fffffff | (uint)bVar2 << 0x1f;
  pIVar1->X0 = in_XMM0_Da;
  pIVar1->Y0 = in_XMM1_Da;
  pIVar1->X1 = in_XMM2_Da;
  pIVar1->Y1 = in_XMM3_Da;
  pIVar1->U0 = in_XMM4_Da;
  pIVar1->V0 = in_XMM5_Da;
  pIVar1->U1 = in_XMM6_Da;
  pIVar1->V1 = in_XMM7_Da;
  pIVar1->AdvanceX = in_stack_00000008 + *(float *)(*(long *)(in_RDI + 0x50) + 0x24);
  if ((*(byte *)(*(long *)(in_RDI + 0x50) + 0x20) & 1) != 0) {
    pIVar1->AdvanceX = (float)(int)(pIVar1->AdvanceX + 0.5);
  }
  *(undefined1 *)(in_RDI + 0x5e) = 1;
  *(int *)(in_RDI + 0x6c) =
       (int)((pIVar1->U1 - pIVar1->U0) * (float)*(int *)(*(long *)(in_RDI + 0x48) + 0x28) + 1.99) *
       (int)((pIVar1->V1 - pIVar1->V0) * (float)*(int *)(*(long *)(in_RDI + 0x48) + 0x2c) + 1.99) +
       *(int *)(in_RDI + 0x6c);
  return;
}

Assistant:

void ImFont::AddGlyph(ImWchar codepoint, float x0, float y0, float x1, float y1, float u0, float v0, float u1, float v1, float advance_x)
{
    Glyphs.resize(Glyphs.Size + 1);
    ImFontGlyph& glyph = Glyphs.back();
    glyph.Codepoint = (unsigned int)codepoint;
    glyph.Visible = (x0 != x1) && (y0 != y1);
    glyph.X0 = x0;
    glyph.Y0 = y0;
    glyph.X1 = x1;
    glyph.Y1 = y1;
    glyph.U0 = u0;
    glyph.V0 = v0;
    glyph.U1 = u1;
    glyph.V1 = v1;
    glyph.AdvanceX = advance_x + ConfigData->GlyphExtraSpacing.x;  // Bake spacing into AdvanceX

    if (ConfigData->PixelSnapH)
        glyph.AdvanceX = IM_ROUND(glyph.AdvanceX);

    // Compute rough surface usage metrics (+1 to account for average padding, +0.99 to round)
    DirtyLookupTables = true;
    MetricsTotalSurface += (int)((glyph.U1 - glyph.U0) * ContainerAtlas->TexWidth + 1.99f) * (int)((glyph.V1 - glyph.V0) * ContainerAtlas->TexHeight + 1.99f);
}